

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::Assemble(TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this,TPZMatrix<std::complex<double>_> *matref,TPZFMatrix<std::complex<double>_> *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  _func_int *p_Var1;
  int iVar2;
  int iVar3;
  long *plVar4;
  int64_t size;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  long lVar6;
  long lVar7;
  size_type __n;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *mat;
  vector<std::thread,_std::allocator<std::thread>_> allthreads;
  TPZVec<int> numelconnected;
  thread local_88;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *local_80;
  size_type local_78;
  TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  *local_70;
  vector<std::thread,_std::allocator<std::thread>_> local_68;
  TPZVec<int> local_50;
  TPZFront<std::complex<double>_> *this_00;
  
  TPZAutoPointer<TPZGuiInterface>::operator=
            ((TPZAutoPointer<TPZGuiInterface> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
              ).field_0xd8,guiInterface);
  local_80 = (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
              *)__dynamic_cast(matref,&TPZMatrix<std::complex<double>>::typeinfo,
                               &TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontSym<std::complex<double>>>
                                ::typeinfo,0);
  if (local_80 ==
      (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
       *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "virtual void TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>>, std::complex<double>, TPZStructMatrixTBBFlow<CSTATE>>::Assemble(TPZMatrix<TVar> &, TPZFMatrix<TVar> &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontSym<std::complex<double>>, TVar = std::complex<double>, TPar = TPZStructMatrixTBBFlow<CSTATE>]"
               ,0x140);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," we are in serious trouble : wrong type of matrix",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZParFrontStructMatrix.cpp"
               ,0x183);
  }
  lVar6 = *(long *)(*(long *)&(this->
                              super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix
                   + -0x60);
  if (*(int *)((long)&(this->
                      super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                      ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh +
              lVar6) < 3) {
    *(undefined4 *)
     ((long)&(this->
             super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh + lVar6) =
         3;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of Threads ",0x12);
  plVar4 = (long *)std::ostream::operator<<
                             (&std::cout,
                              *(int *)((long)&(this->
                                              super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                                              ).super_TPZStructMatrixT<std::complex<double>_>.
                                              super_TPZStructMatrix.fMesh +
                                      *(long *)(*(long *)&(this->
                                                  super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                                                  ).super_TPZStructMatrixT<std::complex<double>_>.
                                                  super_TPZStructMatrix + -0x60)));
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar3 = *(int *)((long)&(this->
                          super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                          ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                          fMesh +
                  *(long *)(*(long *)&(this->
                                      super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                                      ).super_TPZStructMatrixT<std::complex<double>_>.
                                      super_TPZStructMatrix + -0x60));
  __n = (size_type)iVar3;
  std::ostream::flush();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_68,__n,(allocator_type *)&local_50);
  size = TPZCompMesh::NEquations
                   ((this->
                    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                    ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh);
  local_88._M_id._M_thread._0_4_ = 0;
  TPZVec<int>::TPZVec(&local_50,size,(int *)&local_88);
  this->fNElements =
       (((this->
         super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
         ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh)->fElementVec).
       super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  ::OrderElement(&this->
                  super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                );
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  ::GetNumElConnected(&this->
                       super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                      ,&local_50);
  TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  ::SetNumElConnected(&local_80->
                       super_TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                      ,&local_50);
  p_Var1 = (local_80->
           super_TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
           ).super_TPZAbstractFrontMatrix<std::complex<double>_>.
           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
           _vptr_TPZSavable[0x4f];
  if (num_threads.super_argT<int>.super_arg_base.arg_set == true) {
    iVar2 = (*p_Var1)();
    this_00 = (TPZFront<std::complex<double>_> *)CONCAT44(extraout_var,iVar2);
    iVar2 = num_threads.super_argT<int>.value;
  }
  else {
    iVar2 = (*p_Var1)();
    this_00 = (TPZFront<std::complex<double>_> *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = iVar3 + -2;
  }
  TPZFront<std::complex<double>_>::ProductTensorMTInitData(this_00,iVar2);
  this->fStiffness = (TPZMatrix<std::complex<double>_> *)local_80;
  this->fRhs = rhs;
  *(undefined8 *)
   &(this->
    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
    ).field_0xe0 = 0;
  this->fCurrentAssembled = 0;
  local_70 = this;
  std::thread::
  thread<void*(&)(void*),TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>>,std::complex<double>,TPZStructMatrixTBBFlow<std::complex<double>>>*,void>
            (&local_88,GlobalAssemble,&local_70);
  if (local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[__n - 1]._M_id._M_thread == 0) {
    local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start[__n - 1]._M_id._M_thread =
         CONCAT44(local_88._M_id._M_thread._4_4_,(undefined4)local_88._M_id._M_thread);
    std::thread::
    thread<void*(&)(void*),TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontSym<std::complex<double>>>*&,void>
              (&local_88,
               TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
               ::WriteFile,&local_80);
    if (local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[__n - 2]._M_id._M_thread == 0) {
      local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[__n - 2]._M_id._M_thread =
           CONCAT44(local_88._M_id._M_thread._4_4_,(undefined4)local_88._M_id._M_thread);
      local_78 = __n;
      if (2 < iVar3) {
        uVar5 = 0;
        do {
          local_70 = this;
          std::thread::
          thread<void*(&)(void*),TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>>,std::complex<double>,TPZStructMatrixTBBFlow<std::complex<double>>>*,void>
                    (&local_88,ElementAssemble,&local_70);
          if (local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5]._M_id._M_thread != 0) goto LAB_013a96cd;
          local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5]._M_id._M_thread =
               CONCAT44(local_88._M_id._M_thread._4_4_,(undefined4)local_88._M_id._M_thread);
          uVar5 = uVar5 + 1;
        } while (iVar3 - 2 != uVar5);
      }
      if (0 < (int)local_78) {
        lVar7 = local_78 << 3;
        lVar6 = 0;
        do {
          std::thread::join();
          lVar6 = lVar6 + 8;
        } while (lVar7 != lVar6);
      }
      iVar3 = (*(local_80->
                super_TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                ).super_TPZAbstractFrontMatrix<std::complex<double>_>.
                super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x4f])();
      TPZFront<std::complex<double>_>::ProductTensorMTFinish
                ((TPZFront<std::complex<double>_> *)CONCAT44(extraout_var_01,iVar3));
      this->fStiffness = (TPZMatrix<std::complex<double>_> *)0x0;
      this->fRhs = (TPZFMatrix<std::complex<double>_> *)0x0;
      local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (local_50.fStore != (int *)0x0) {
        operator_delete__(local_50.fStore);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_68);
      return;
    }
  }
LAB_013a96cd:
  std::terminate();
}

Assistant:

void TPZParFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZMatrix<TVar> & matref, TPZFMatrix<TVar> & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface)
{
	this->fGuiInterface = guiInterface;
	
#ifdef STACKSTORAGE
	TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *>(&matref);
#else
    TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (&matref);
    
#endif
	if(!mat)
	{
		std::cout << __PRETTY_FUNCTION__ << " we are in serious trouble : wrong type of matrix"<< std::endl;
		DebugStop();
	}
	
	int nthreads;
	//cout << "Number of Threads " << endl;
	//cin >> nthreads;
	//fNThreads = nthreads;
    if (this->fNumThreads < 3) {
        this->fNumThreads = 3;
    }
	std::cout << "Number of Threads " << this->fNumThreads << std::endl;
	nthreads = this->fNumThreads;
	std::cout.flush();
	//int nthreads = fNThreads+1;
	
    std::vector<std::thread> allthreads(nthreads);
	int i;
	
	TPZVec <int> numelconnected(this->fMesh->NEquations(),0);
	//TPZFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZStackEqnStorage, TFront>(fMesh->NEquations());
	
	//TPZFrontMatrix<TPZFileEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZFileEqnStorage, TFront>(fMesh->NEquations());
	
	
	
	
	//TPZParFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZParFrontMatrix<TPZStackEqnStorage, TFront>(this->fMesh->NEquations());
	fNElements = this->fMesh->NElements();
	
	this->OrderElement();
	
//	this->AdjustSequenceNumbering();
    
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        this->fMesh->Print(sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	
	this->GetNumElConnected(numelconnected);
	
	mat->SetNumElConnected(numelconnected);
	
    if (num_threads.was_set())
        mat->GetFront().ProductTensorMTInitData(num_threads.get_value());
    else
        mat->GetFront().ProductTensorMTInitData( nthreads - 2 ); // Here it initializes the multthread decomposition (comment to deactivate. Remember to coment the Finish also)
	
	fStiffness = mat;
	fRhs = &rhs;
	fCurrentElement = 0;
	fCurrentAssembled = 0;
    
	/*
	 *Triger 'n' threads passing Assemble as argument
	 */
	// try{
    allthreads[nthreads-1] = std::thread(this->GlobalAssemble,this);
//                                        this->GlobalAssemble, this, __FUNCTION__);
//	if(!res[nthreads-1]){
//#ifdef VC
//		cout << "GlobalAssemble Thread created Successfuly "<< allthreads[nthreads-1].x << endl;
//#else
//		std::cout << "GlobalAssemble Thread created Successfuly "<< allthreads[nthreads-1] << std::endl;
//#endif
//		std::cout.flush();
//	}else{
//#ifdef VC
//		std::cout << "GlobalAssemble Thread Fail "<< allthreads[nthreads-1].x << std::endl;
//#else
//		std::cout << "GlobalAssemble Thread Fail "<< allthreads[nthreads-1] << std::endl;
//#endif
//		std::cout.flush();
//		//          DebugStop();
//	}
    allthreads[nthreads-2] = std::thread(mat->WriteFile,mat);
//                                        mat->WriteFile, mat, __FUNCTION__);
//	if(!res[nthreads-2]){
//#ifdef VC
//		cout << "WriteFile Thread created Successfuly "<< allthreads[nthreads-2].x << endl;
//#else
//		std::cout << "WriteFile Thread created Successfuly "<< allthreads[nthreads-2] << std::endl;
//#endif
//		std::cout.flush();
//	}else{
//#ifdef VC
//		std::cout << "WriteFile Thread Fail "<< allthreads[nthreads-2].x << std::endl;
//#else
//		std::cout << "WriteFile Thread Fail "<< allthreads[nthreads-2] << std::endl;
//#endif
//		std::cout.flush();
//		//          DebugStop();
//	}
	
	for(i=0;i<nthreads-2;i++){
        allthreads[i] = std::thread(this->ElementAssemble,this);
//		if(!res[i]){
//#ifdef VC
//			cout << "ElementAssemble Thread "<< i+1 <<  " created Successfuly "<< allthreads[i].x << endl;
//#else
//			std::cout << "ElementAssemble Thread "<< i+1 <<  " created Successfuly "<< allthreads[i] << std::endl;
//#endif
//			std::cout.flush();
//		}else{
//			std::cout << "Error " << res[i] << "\t";
//#ifdef VC
//			std::cout << "ElementAssemble Thread "<< i+1 << " Fail " << allthreads[i].x << std::endl;
//#else
//			std::cout << "ElementAssemble Thread "<< i+1 << " Fail " << allthreads[i] << std::endl;
//#endif
//			std::cout.flush();
//		}
	}
	for(i=0;i<nthreads;i++) {
        allthreads[i].join();
	}
	
	mat->GetFront().ProductTensorMTFinish(); // Here it ends the multthread decomposition (comment to deactivate. Remember to coment the initialization also)
	fStiffness = 0;
	fRhs = 0;
    
}